

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::split
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this)

{
  long in_RDI;
  DataFlowState copied;
  DataFlowState *in_stack_fffffffffffffdd8;
  DataFlowState *this_00;
  DataFlowState *in_stack_fffffffffffffe60;
  DataFlowAnalysis *in_stack_fffffffffffffe68;
  DataFlowState *in_stack_fffffffffffffeb0;
  DataFlowState *in_stack_fffffffffffffeb8;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffec0;
  DataFlowState local_a8;
  
  if ((*(byte *)(in_RDI + 0x550) & 1) == 0) {
    this_00 = &local_a8;
    DataFlowAnalysis::copyState(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    DataFlowState::DataFlowState(this_00,in_stack_fffffffffffffdd8);
    DataFlowState::DataFlowState(this_00,in_stack_fffffffffffffdd8);
    setConditionalState(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                        in_stack_fffffffffffffeb0);
    DataFlowState::~DataFlowState((DataFlowState *)0x8204da);
    DataFlowState::~DataFlowState((DataFlowState *)0x8204e7);
    DataFlowState::~DataFlowState((DataFlowState *)0x8204f4);
  }
  return;
}

Assistant:

void split() {
        if (!isStateSplit) {
            auto copied = (DERIVED).copyState(state);
            setConditionalState(std::move(copied), std::move(state));
        }
    }